

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hypergraph.cpp
# Opt level: O0

void __thiscall
Hypergraph::enumerate(Hypergraph *this,edge *x,edge *y,size_type r,edge_vec *minimal_hitting_sets)

{
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  int iVar1;
  string *local_1b0;
  reference local_170;
  undefined1 local_160 [8];
  edge yv;
  reference local_138;
  undefined1 local_128 [8];
  edge yv_1;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_f9;
  duration local_f8;
  duration local_f0;
  string *local_e8;
  string local_e0;
  string local_c0;
  iterator local_a0;
  size_type local_98;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_90;
  time_point local_78;
  time_point now;
  reference local_60;
  undefined1 local_50 [8];
  edge xv;
  edge_vec *minimal_hitting_sets_local;
  size_type r_local;
  edge *y_local;
  edge *x_local;
  Hypergraph *this_local;
  
  xv.m_num_bits = (size_type)minimal_hitting_sets;
  boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::dynamic_bitset
            ((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)local_50,x);
  local_60 = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       ((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)local_50,r)
  ;
  boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::reference::operator=
            (&local_60,true);
  iVar1 = extendable(this,(edge *)local_50,y);
  if (iVar1 == 0) {
    boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::dynamic_bitset
              ((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)local_128,y);
    local_138 = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                          ((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)
                           local_128,r);
    boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::reference::operator=
              (&local_138,true);
    enumerate(this,x,(edge *)local_128,r + 1,(edge_vec *)xv.m_num_bits);
    yv.m_num_bits._4_4_ = 1;
    boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::~dynamic_bitset
              ((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)local_128);
  }
  else {
    if (iVar1 == 1) {
      enumerate(this,(edge *)local_50,y,r + 1,(edge_vec *)xv.m_num_bits);
    }
    else if (iVar1 == 2) {
      std::
      vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
      ::push_back((vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                   *)xv.m_num_bits,(value_type *)local_50);
      if (((this->m_configuration).collect_hitting_set_statistics & 1U) != 0) {
        local_78.__d.__r = (duration)std::chrono::_V2::system_clock::now();
        local_e8 = &local_e0;
        edge_to_string_abi_cxx11_(local_e8,(edge *)local_50);
        local_e8 = &local_c0;
        local_f0.__r = (this->m_hitting_set_timestamp).__d.__r;
        local_f8 = local_78.__d.__r;
        ns_string_abi_cxx11_(local_e8,(time_point)local_f0.__r,local_78);
        local_a0 = &local_e0;
        local_98 = 2;
        std::
        allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::allocator(&local_f9);
        __l._M_len = local_98;
        __l._M_array = local_a0;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector(&local_90,__l,&local_f9);
        Table::add_record(&this->m_hitting_set_stats,&local_90);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_90);
        std::
        allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~allocator(&local_f9);
        local_1b0 = (string *)&local_a0;
        do {
          local_1b0 = local_1b0 + -1;
          std::__cxx11::string::~string((string *)local_1b0);
        } while (local_1b0 != &local_e0);
        yv_1.m_num_bits = std::chrono::_V2::system_clock::now();
        (this->m_hitting_set_timestamp).__d.__r = yv_1.m_num_bits;
      }
    }
    boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::dynamic_bitset
              ((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)local_160,y);
    local_170 = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                          ((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)
                           local_160,r);
    boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::reference::operator=
              (&local_170,true);
    iVar1 = extendable(this,x,(edge *)local_160);
    if (iVar1 != 0) {
      enumerate(this,x,(edge *)local_160,r + 1,(edge_vec *)xv.m_num_bits);
    }
    boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::~dynamic_bitset
              ((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)local_160);
    yv.m_num_bits._4_4_ = 0;
  }
  boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::~dynamic_bitset
            ((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)local_50);
  return;
}

Assistant:

void Hypergraph::enumerate(const edge &x, const edge &y, edge::size_type r, edge_vec &minimal_hitting_sets) {
	edge xv = x;
	xv[r] = 1;
	switch (extendable(xv, y)) {
	case MINIMAL:
	{
		minimal_hitting_sets.push_back(xv);
		if (m_configuration.collect_hitting_set_statistics) {
			auto now = Clock::now();
			m_hitting_set_stats.add_record({ edge_to_string(xv), ns_string(m_hitting_set_timestamp, now) });
			m_hitting_set_timestamp = Clock::now();
		}
		break;
	}
	case EXTENDABLE:
		enumerate(xv, y, r + 1, minimal_hitting_sets);
		break;
	case NOT_EXTENDABLE:
		edge yv = y;
		yv[r] = 1;
		enumerate(x, yv, r + 1, minimal_hitting_sets);
		return;
	}
	edge yv = y;
	yv[r] = 1;
	if (extendable(x, yv)) enumerate(x, yv, r + 1, minimal_hitting_sets);
}